

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

string * __thiscall
EOPlus::token_got_string_abi_cxx11_(string *__return_storage_ptr__,EOPlus *this,Token *t)

{
  int iVar1;
  long lVar2;
  undefined6 uVar3;
  bool bVar4;
  uint uVar5;
  long *plVar6;
  string *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  long *plVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long local_70;
  long lStack_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  ulong local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  iVar1 = *(int *)this;
  if (iVar1 < 0x10) {
    switch(iVar1) {
    case 0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "invalid token";
      pcVar11 = "";
      goto LAB_0013dac8;
    case 1:
      util::variant::GetString_abi_cxx11_(&local_a0,(variant *)(this + 8));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a48cf);
      local_80._M_allocated_capacity = (size_type)&local_70;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_70 = *plVar8;
        lStack_68 = plVar6[3];
      }
      else {
        local_70 = *plVar8;
        local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
      }
      local_80._8_8_ = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_80._M_local_buf);
      break;
    case 2:
      util::variant::GetString_abi_cxx11_(&local_40,(variant *)(this + 8));
      if (local_40._M_string_length < 0x11) {
        local_60 = &local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          local_50._8_8_ = local_40.field_2._8_8_;
        }
        else {
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_40._M_dataplus._M_p;
        }
        local_50._M_allocated_capacity._1_7_ = local_40.field_2._M_allocated_capacity._1_7_;
        local_50._M_local_buf[0] = local_40.field_2._M_local_buf[0];
        local_58 = local_40._M_string_length;
        local_40._M_string_length = 0;
        local_40.field_2._M_local_buf[0] = '\0';
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_40);
        plVar6 = (long *)std::__cxx11::string::append(local_80._M_local_buf);
        local_60 = &local_50;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_50._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_50._8_8_ = plVar6[3];
        }
        else {
          local_50._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
        }
        local_58 = plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((long *)local_80._M_allocated_capacity != &local_70) {
          operator_delete((void *)local_80._M_allocated_capacity,local_70 + 1);
        }
      }
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1a48dc);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar7) {
        local_a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_a0.field_2._8_8_ = plVar6[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_a0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_a0._M_string_length = plVar6[1];
      *plVar6 = (long)paVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar9) {
        lVar2 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return (string *)&local_40.field_2;
      }
      uVar13 = CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                        local_40.field_2._M_local_buf[0]);
      _Var14._M_p = local_40._M_dataplus._M_p;
      goto LAB_0013df7d;
    default:
      goto switchD_0013d786_caseD_3;
    case 4:
      util::variant::GetString_abi_cxx11_(&local_a0,(variant *)(this + 8));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a48e5);
      local_80._M_allocated_capacity = (size_type)&local_70;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_70 = *plVar8;
        lStack_68 = plVar6[3];
      }
      else {
        local_70 = *plVar8;
        local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
      }
      local_80._8_8_ = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_80._M_local_buf);
      break;
    case 8:
      util::variant::GetString_abi_cxx11_(&local_a0,(variant *)(this + 8));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a48ef);
      local_80._M_allocated_capacity = (size_type)&local_70;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_70 = *plVar8;
        lStack_68 = plVar6[3];
      }
      else {
        local_70 = *plVar8;
        local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
      }
      local_80._8_8_ = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_80._M_local_buf);
    }
LAB_0013dbd2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar2 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((long *)local_80._M_allocated_capacity != &local_70) {
      operator_delete((void *)local_80._M_allocated_capacity,local_70 + 1);
    }
    uVar13 = local_a0.field_2._M_allocated_capacity;
    _Var14._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return (string *)&local_a0.field_2;
    }
    goto LAB_0013df7d;
  }
  if (0x3f < iVar1) {
    if (iVar1 == 0x40) {
      util::variant::GetString_abi_cxx11_(&local_a0,(variant *)(this + 8));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a490c);
      local_80._M_allocated_capacity = (size_type)&local_70;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_70 = *plVar8;
        lStack_68 = plVar6[3];
      }
      else {
        local_70 = *plVar8;
        local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
      }
      local_80._8_8_ = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_80._M_local_buf);
      goto LAB_0013dbd2;
    }
    if (iVar1 == 0x80) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "new-line";
      pcVar11 = "";
      goto LAB_0013dac8;
    }
    if (iVar1 == 0x100) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "end of file";
      pcVar11 = "";
      goto LAB_0013dac8;
    }
switchD_0013d786_caseD_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "unknown token";
    pcVar11 = "";
LAB_0013dac8:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar12,pcVar11);
    return extraout_RAX;
  }
  if (iVar1 == 0x10) {
    bVar4 = util::variant::GetBool((variant *)(this + 8));
    pcVar11 = "false";
    if (bVar4) {
      pcVar11 = "true";
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,pcVar11,pcVar11 + ((ulong)bVar4 ^ 5));
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a48f7);
    local_80._M_allocated_capacity = (size_type)&local_70;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_70 = *plVar8;
      lStack_68 = plVar6[3];
    }
    else {
      local_70 = *plVar8;
      local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
    }
    local_80._8_8_ = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::__cxx11::string::append(local_80._M_local_buf);
    goto LAB_0013df18;
  }
  if (iVar1 != 0x20) goto switchD_0013d786_caseD_3;
  pcVar11 = local_a0.field_2._M_local_buf + 1;
  uVar5 = util::variant::GetInt((variant *)(this + 8));
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  uVar5 = uVar5 & 0xff;
  uVar3 = local_a0.field_2._M_allocated_capacity._2_6_;
  if (0x4b < uVar5) {
    if (uVar5 < 0x5e) {
      if (uVar5 == 0x4c) {
        local_a0.field_2._M_allocated_capacity._0_2_ = 0x7c7c;
        local_a0.field_2._M_allocated_capacity =
             CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
        goto LAB_0013de9a;
      }
      if (uVar5 != 0x5c) goto switchD_0013d836_caseD_2;
      local_a0.field_2._M_local_buf[0] = 0x7c;
    }
    else {
      if (uVar5 != 0x5e) {
        if (uVar5 == 0x9e) {
          local_a0.field_2._M_allocated_capacity._0_2_ = 0x2626;
          local_a0.field_2._M_allocated_capacity =
               CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
        }
        else {
          if (uVar5 != 0xf5) goto switchD_0013d836_caseD_2;
          local_a0.field_2._M_allocated_capacity._0_2_ = 0x3d21;
          local_a0.field_2._M_allocated_capacity =
               CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
        }
        goto LAB_0013de9a;
      }
      local_a0.field_2._M_local_buf[0] = 0x7e;
    }
    goto LAB_0013de89;
  }
  switch(uVar5) {
  case 1:
    local_a0.field_2._M_local_buf[0] = 0x21;
    break;
  default:
switchD_0013d836_caseD_2:
    local_a0.field_2._M_allocated_capacity = 0x6e776f6e6b6e7528;
    local_a0.field_2._M_local_buf[8] = 0x29;
    local_a0._M_string_length = 9;
    pcVar11 = local_a0.field_2._M_local_buf + 9;
    goto LAB_0013de9f;
  case 5:
    local_a0.field_2._M_local_buf[0] = 0x25;
    break;
  case 6:
    local_a0.field_2._M_local_buf[0] = 0x26;
    break;
  case 8:
    local_a0.field_2._M_local_buf[0] = 0x28;
    break;
  case 9:
    local_a0.field_2._M_local_buf[0] = 0x29;
    break;
  case 10:
    local_a0.field_2._M_local_buf[0] = 0x2a;
    break;
  case 0xb:
    local_a0.field_2._M_local_buf[0] = 0x2b;
    break;
  case 0xd:
  case 0x15:
    local_a0.field_2._M_local_buf[0] = 0x2d;
    break;
  case 0xf:
    local_a0.field_2._M_local_buf[0] = 0x2f;
    break;
  case 0x10:
    local_a0.field_2._M_allocated_capacity._0_2_ = 0x3d3c;
    local_a0.field_2._M_allocated_capacity =
         CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
    goto LAB_0013de9a;
  case 0x11:
    local_a0.field_2._M_allocated_capacity._0_2_ = 0x3d3d;
    local_a0.field_2._M_allocated_capacity =
         CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
    goto LAB_0013de9a;
  case 0x12:
    local_a0.field_2._M_allocated_capacity._0_2_ = 0x3d3e;
    local_a0.field_2._M_allocated_capacity =
         CONCAT62(uVar3,local_a0.field_2._M_allocated_capacity._0_2_);
LAB_0013de9a:
    local_a0._M_string_length = 2;
    pcVar11 = local_a0.field_2._M_local_buf + 2;
    goto LAB_0013de9f;
  case 0x1c:
    local_a0.field_2._M_local_buf[0] = 0x3c;
    break;
  case 0x1d:
    local_a0.field_2._M_local_buf[0] = 0x3d;
    break;
  case 0x1e:
    local_a0.field_2._M_local_buf[0] = 0x3e;
  }
LAB_0013de89:
  local_a0._M_string_length = 1;
LAB_0013de9f:
  *pcVar11 = '\0';
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1a4901);
  local_80._M_allocated_capacity = (size_type)&local_70;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_70 = *plVar8;
    lStack_68 = plVar6[3];
  }
  else {
    local_70 = *plVar8;
    local_80._M_allocated_capacity = (size_type)(long *)*plVar6;
  }
  local_80._8_8_ = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::append(local_80._M_local_buf);
LAB_0013df18:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(paVar7->_M_local_buf + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)paVar7->_M_allocated_capacity == paVar10) {
    lVar2 = *(long *)(paVar7->_M_local_buf + 0x18);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7->_M_allocated_capacity;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = *(size_type *)(paVar7->_M_local_buf + 8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)paVar7 = paVar10;
  *(size_type *)(paVar7->_M_local_buf + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(paVar7->_M_local_buf + 0x10))->_M_local_buf[0] = '\0';
  if ((long *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,local_70 + 1);
    paVar7 = extraout_RAX_00;
  }
  uVar13 = local_a0.field_2._M_allocated_capacity;
  _Var14._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_0013df7d:
    operator_delete(_Var14._M_p,uVar13 + 1);
    paVar7 = extraout_RAX_01;
  }
  return (string *)paVar7;
}

Assistant:

static std::string token_got_string(Token t)
	{
		switch (t.type)
		{
			case Token::Invalid:    return "invalid token";
			case Token::Identifier: return "identifier '" + std::string(t.data) + "'";
			case Token::String:     return "string '" + cut_string(t.data) + "'";
			case Token::Integer:    return "integer '" + std::string(t.data) + "'";
			case Token::Float:      return "float '" + std::string(t.data) + "'";
			case Token::Boolean:    return "boolean '" + std::string(bool(t.data) ? "true" : "false") + "'";
			case Token::Operator:   return "operator '" + op_to_string(int(t.data)) + "'";
			case Token::Symbol:     return "symbol '" + std::string(t.data) + "'";
			case Token::NewLine:    return "new-line";
			case Token::EndOfFile:  return "end of file";
		}

		return "unknown token";
	}